

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O0

void drawGuards(WINDOW *body,Map *map,UnitList *guards)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  char type;
  Guard *guard;
  UnitNode *guardNode;
  int x;
  int *coordinates;
  UnitList *guards_local;
  Map *map_local;
  WINDOW *body_local;
  
  guard = (Guard *)getHead(guards);
  pcVar2 = *(char **)guard;
  piVar4 = getCoordinate(*(int *)(pcVar2 + 4));
  cVar1 = *pcVar2;
  iVar3 = wmove(body,*piVar4,piVar4[1]);
  if (iVar3 != -1) {
    waddch(body,(int)cVar1);
  }
  for (guardNode._4_4_ = 1; iVar3 = getLength(guards), guardNode._4_4_ < iVar3 + -2;
      guardNode._4_4_ = guardNode._4_4_ + 1) {
    guard = *(Guard **)&guard->damage;
    pcVar2 = *(char **)guard;
    piVar4 = getCoordinate(*(int *)(pcVar2 + 4));
    cVar1 = *pcVar2;
    iVar3 = wmove(body,*piVar4,piVar4[1]);
    if (iVar3 != -1) {
      waddch(body,(int)cVar1);
    }
  }
  return;
}

Assistant:

void drawGuards(WINDOW *body, struct Map *map, struct UnitList *guards) {
    int *coordinates;
    int x;
    struct UnitNode *guardNode;
    struct Guard *guard;
    char type;
    guardNode = getHead(guards);
    guard = (struct Guard *) guardNode->unit;
    coordinates = getCoordinate(guard->position);
    type = guard->type;
    mvwaddch(body, coordinates[0], coordinates[1], type);
    for (x = 1; x < getLength(guards) - 2; x++) {
        guardNode = guardNode->next;
        guard = (struct Guard *) guardNode->unit;
        coordinates = getCoordinate(guard->position);
        type = guard->type;
        mvwaddch(body, coordinates[0], coordinates[1], type);
    }
}